

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall BenevolentBotStrategy::fortifyToCountryIndex(BenevolentBotStrategy *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  size_type sVar3;
  reference ppCVar4;
  int local_1c;
  int local_18;
  int i;
  int numTroops;
  int toCountry;
  BenevolentBotStrategy *this_local;
  
  i = 0;
  local_18 = 9999;
  local_1c = 0;
  while( true ) {
    pvVar2 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
    sVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_1c) break;
    pvVar2 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
    ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (pvVar2,(long)local_1c);
    iVar1 = Map::Country::getNumberOfTroops(*ppCVar4);
    if (iVar1 < local_18) {
      i = local_1c;
      pvVar2 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
      ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (pvVar2,(long)local_1c);
      local_18 = Map::Country::getNumberOfTroops(*ppCVar4);
      pvVar2 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
      ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (pvVar2,(long)local_1c);
      (this->super_PlayerStrategy).to = *ppCVar4;
    }
    local_1c = local_1c + 1;
  }
  return i;
}

Assistant:

int BenevolentBotStrategy::fortifyToCountryIndex() {
    int toCountry = 0;
    int numTroops = 9999;

    for(int i = 0; i < from->getAdjCountries()->size(); i++){
        if(from->getAdjCountries()->at(i)->getNumberOfTroops() < numTroops){
            toCountry = i;
            numTroops = from->getAdjCountries()->at(i)->getNumberOfTroops();
            to = from->getAdjCountries()->at(i);
        }
    }
    return toCountry;
}